

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caseconvert.cpp
# Opt level: O2

string_t __thiscall
duckdb::CaseConvertOperator<false>::Operation<duckdb::string_t,duckdb::string_t>
          (CaseConvertOperator<false> *this,string_t input,Vector *result)

{
  Vector *vector;
  idx_t len;
  char *result_data;
  char *input_data;
  anon_union_16_2_67f50693_for_value local_38;
  undefined8 local_28;
  char *local_20;
  
  local_20 = input.value._0_8_;
  input_data = (char *)((long)&local_28 + 4);
  if (0xc < (uint)this) {
    input_data = local_20;
  }
  local_28 = this;
  vector = (Vector *)GetResultLength<false>(input_data,(ulong)this & 0xffffffff);
  local_38.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString(input.value._8_8_,vector,len);
  result_data = local_38._8_8_;
  if (local_38._0_4_ < 0xd) {
    result_data = local_38.pointer.prefix;
  }
  CaseConvert<false>(input_data,(ulong)this & 0xffffffff,result_data);
  string_t::Finalize((string_t *)&local_38.pointer);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_38.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto input_data = input.GetData();
		auto input_length = input.GetSize();
		return UnicodeCaseConvert<IS_UPPER>(result, input_data, input_length);
	}